

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O1

void __thiscall SemanticTables::visit(SemanticTables *this,VarDeclNode *varDeclNode)

{
  VarDeclNode *pVVar1;
  TokenNode *pTVar2;
  TokenNode *pTVar3;
  char *lexeme;
  int iVar4;
  StructSymbol *pSVar5;
  int iVar6;
  IdListNode *pIVar7;
  bool bVar8;
  
  pVVar1 = varDeclNode->next;
  if (pVVar1 != (VarDeclNode *)0x0) {
    (*(pVVar1->super_ASTNode)._vptr_ASTNode[3])(pVVar1,this);
  }
  pIVar7 = varDeclNode->idlist;
  if (pIVar7 != (IdListNode *)0x0) {
    (*(pIVar7->super_ASTNode)._vptr_ASTNode[3])(pIVar7,this);
  }
  pIVar7 = varDeclNode->idlist;
  do {
    if (pIVar7 == (IdListNode *)0x0) {
      return;
    }
    pTVar2 = pIVar7->id;
    bVar8 = true;
    if ((pTVar2->super_ExpNode).pointer == false) {
      bVar8 = pIVar7->pointer != (PointerNode *)0x0;
    }
    pTVar3 = varDeclNode->type->id;
    iVar6 = pTVar3->token;
    (pTVar2->super_ExpNode).type = iVar6;
    lexeme = (pTVar3->super_ExpNode).lexeme;
    (pTVar2->super_ExpNode).typeLexeme = lexeme;
    (pTVar2->super_ExpNode).pointer = bVar8;
    (pTVar2->super_ExpNode).arraySize = (pTVar3->super_ExpNode).arraySize;
    if ((iVar6 == 10) &&
       (pSVar5 = StructTable::cSearch(structTable,lexeme), pSVar5 == (StructSymbol *)0x0)) {
      visit();
      bVar8 = false;
    }
    else {
      iVar6 = 4;
      if (bVar8 == false) {
        pTVar2 = pIVar7->id;
        iVar4 = (pTVar2->super_ExpNode).type;
        if (1 < iVar4 - 0xbU) {
          if (iVar4 == 10) {
            pSVar5 = StructTable::cSearch(structTable,(pTVar2->super_ExpNode).typeLexeme);
            iVar6 = pSVar5->size;
          }
          else {
            iVar6 = 1;
          }
        }
      }
      if (pIVar7->array == (ArrayNode *)0x0) {
        iVar4 = -1;
      }
      else {
        iVar4 = atoi((pIVar7->array->super_ExpNode).lexeme);
        iVar6 = iVar6 * iVar4;
      }
      bVar8 = VarTable::cInsert(varTable,varDeclNode->type,(pIVar7->id->super_ExpNode).lexeme,bVar8,
                                iVar4,false,iVar6);
      if (!bVar8) {
        visit();
      }
      pIVar7 = pIVar7->next;
      bVar8 = true;
    }
  } while (bVar8);
  return;
}

Assistant:

void SemanticTables::visit(VarDeclNode *varDeclNode) {

    if (varDeclNode->getNext() != NULL) {
        varDeclNode->getNext()->accept(this);
    }

    if (varDeclNode->getIdList() != NULL) {
        varDeclNode->getIdList()->accept(this);
    }

    IdListNode *idListAux = varDeclNode->getIdList();
    while (idListAux != NULL) {

        bool isPointer = idListAux->getId()->isPointer() || (idListAux->getPointer() != NULL);

        idListAux->getId()->setType(varDeclNode->getType()->getId()->getToken());
        idListAux->getId()->setTypeLexeme(varDeclNode->getType()->getId()->getLexeme());
        idListAux->getId()->setPointer(isPointer);
        idListAux->getId()->setArraySize(varDeclNode->getType()->getId()->getArraySize());
        if (varDeclNode->getType()->getType() == ID) {
            if (!structTable->cSearch(idListAux->getId()->getTypeLexeme())) {
                fprintf(stderr, "[SEMANTIC ERROR - VarDeclNode] UNKNOWN VARIABLE TYPE line: %d type: %s \n",
                        idListAux->getLine(), idListAux->getId()->getTypeLexeme());

                return;
            }

        }

        int size = 0;
        // Set var size
        if( idListAux->getId()->getType() == INT ||idListAux->getId()->getType() == FLOAT || isPointer)
            size = INT32_SIZE;
        else if (idListAux->getId()->getType() == ID) {
            StructSymbol* structSymbol = structTable->cSearch(idListAux->getId()->getTypeLexeme());
            size = structSymbol->getSize();
        } else {
            size = INT8_SIZE;
        }

        int arraySize = -1;

        if (idListAux->getArray()) {
            arraySize = atoi(idListAux->getArray()->getLexeme());
            size *= arraySize;
        }

        if (!varTable->cInsert(varDeclNode->getType(), idListAux->getId()->getLexeme(), isPointer,
                               arraySize, BOOL_FALSE, size)) {
            fprintf(stderr, "[SEMANTIC ERROR - VarDeclNode] DUPLICATED VARIABLE NAME line: %d lexeme: %s \n",
                    idListAux->getLine(), idListAux->getId()->getLexeme());

        }
        idListAux = idListAux->getNext();
    }

}